

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

void __thiscall nv::DDSHeader::swapBytes(DDSHeader *this)

{
  int local_14;
  int i;
  DDSHeader *this_local;
  
  this->fourcc = this->fourcc;
  this->size = this->size;
  this->flags = this->flags;
  this->height = this->height;
  this->width = this->width;
  this->pitch = this->pitch;
  this->depth = this->depth;
  this->mipmapcount = this->mipmapcount;
  for (local_14 = 0; local_14 < 0xb; local_14 = local_14 + 1) {
    this->reserved[local_14] = this->reserved[local_14];
  }
  (this->pf).size = (this->pf).size;
  (this->pf).flags = (this->pf).flags;
  (this->pf).fourcc = (this->pf).fourcc;
  (this->pf).bitcount = (this->pf).bitcount;
  (this->pf).rmask = (this->pf).rmask;
  (this->pf).gmask = (this->pf).gmask;
  (this->pf).bmask = (this->pf).bmask;
  (this->pf).amask = (this->pf).amask;
  (this->caps).caps1 = (this->caps).caps1;
  (this->caps).caps2 = (this->caps).caps2;
  (this->caps).caps3 = (this->caps).caps3;
  (this->caps).caps4 = (this->caps).caps4;
  this->notused = this->notused;
  (this->header10).dxgiFormat = (this->header10).dxgiFormat;
  (this->header10).resourceDimension = (this->header10).resourceDimension;
  (this->header10).miscFlag = (this->header10).miscFlag;
  (this->header10).arraySize = (this->header10).arraySize;
  (this->header10).reserved = (this->header10).reserved;
  return;
}

Assistant:

void DDSHeader::swapBytes()
{
	this->fourcc = POSH_LittleU32(this->fourcc);
	this->size = POSH_LittleU32(this->size);
	this->flags = POSH_LittleU32(this->flags);
	this->height = POSH_LittleU32(this->height);
	this->width = POSH_LittleU32(this->width);
	this->pitch = POSH_LittleU32(this->pitch);
	this->depth = POSH_LittleU32(this->depth);
	this->mipmapcount = POSH_LittleU32(this->mipmapcount);
	
	for(int i = 0; i < 11; i++) {
		this->reserved[i] = POSH_LittleU32(this->reserved[i]);
	}

	this->pf.size = POSH_LittleU32(this->pf.size);
	this->pf.flags = POSH_LittleU32(this->pf.flags);
	this->pf.fourcc = POSH_LittleU32(this->pf.fourcc);
	this->pf.bitcount = POSH_LittleU32(this->pf.bitcount);
	this->pf.rmask = POSH_LittleU32(this->pf.rmask);
	this->pf.gmask = POSH_LittleU32(this->pf.gmask);
	this->pf.bmask = POSH_LittleU32(this->pf.bmask);
	this->pf.amask = POSH_LittleU32(this->pf.amask);
	this->caps.caps1 = POSH_LittleU32(this->caps.caps1);
	this->caps.caps2 = POSH_LittleU32(this->caps.caps2);
	this->caps.caps3 = POSH_LittleU32(this->caps.caps3);
	this->caps.caps4 = POSH_LittleU32(this->caps.caps4);
	this->notused = POSH_LittleU32(this->notused);

	this->header10.dxgiFormat = POSH_LittleU32(this->header10.dxgiFormat);
	this->header10.resourceDimension = POSH_LittleU32(this->header10.resourceDimension);
	this->header10.miscFlag = POSH_LittleU32(this->header10.miscFlag);
	this->header10.arraySize = POSH_LittleU32(this->header10.arraySize);
	this->header10.reserved = POSH_LittleU32(this->header10.reserved);
}